

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_Error FT_Stream_ReadFields(FT_Stream stream,FT_Frame_Field *fields,void *structure)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ulong *puVar4;
  FT_UInt len;
  FT_Byte *p;
  ulong uStack_40;
  FT_Int sign_shift;
  FT_ULong value;
  FT_Byte *cursor;
  FT_Bool frame_accessed;
  FT_Error error;
  void *structure_local;
  FT_Frame_Field *fields_local;
  FT_Stream stream_local;
  
  bVar2 = false;
  if (fields == (FT_Frame_Field *)0x0) {
    stream_local._4_4_ = 6;
  }
  else {
    if (stream != (FT_Stream)0x0) {
      value = (FT_ULong)stream->cursor;
      cursor._4_4_ = 0;
      structure_local = fields;
      do {
        switch(*structure_local) {
        case 4:
          cursor._4_4_ = FT_Stream_EnterFrame(stream,(ulong)*(ushort *)((long)structure_local + 2));
          if (cursor._4_4_ == 0) {
            bVar2 = true;
            value = (FT_ULong)stream->cursor;
            goto LAB_002db1bd;
          }
          goto LAB_002db1cb;
        default:
          stream->cursor = (uchar *)value;
LAB_002db1cb:
          if (bVar2) {
            FT_Stream_ExitFrame(stream);
          }
          return cursor._4_4_;
        case 8:
        case 9:
          uStack_40 = (ulong)*(byte *)value;
          p._4_1_ = 0x18;
          value = value + 1;
          break;
        case 0xc:
        case 0xd:
          uStack_40 = (ulong)CONCAT11(*(undefined1 *)value,*(undefined1 *)(value + 1));
          p._4_1_ = 0x10;
          value = value + 2;
          break;
        case 0xe:
        case 0xf:
          uStack_40 = (ulong)*(ushort *)value;
          p._4_1_ = 0x10;
          value = value + 2;
          break;
        case 0x10:
        case 0x11:
          uStack_40 = (ulong)((uint)*(byte *)value << 0x18 | (uint)*(byte *)(value + 1) << 0x10 |
                              (uint)*(byte *)(value + 2) << 8 | (uint)*(byte *)(value + 3));
          p._4_1_ = 0;
          value = value + 4;
          break;
        case 0x12:
        case 0x13:
          uStack_40 = (ulong)((uint)*(byte *)(value + 3) << 0x18 |
                              (uint)*(byte *)(value + 2) << 0x10 | (uint)*(byte *)(value + 1) << 8 |
                             (uint)*(byte *)value);
          p._4_1_ = 0;
          value = value + 4;
          break;
        case 0x14:
        case 0x15:
          uStack_40 = (ulong)((uint)*(byte *)value << 0x10 | (uint)*(byte *)(value + 1) << 8 |
                             (uint)*(byte *)(value + 2));
          p._4_1_ = 8;
          value = value + 3;
          break;
        case 0x16:
        case 0x17:
          uStack_40 = (ulong)((uint)*(byte *)(value + 2) << 0x10 | (uint)*(byte *)(value + 1) << 8 |
                             (uint)*(byte *)value);
          p._4_1_ = 8;
          value = value + 3;
          break;
        case 0x18:
        case 0x19:
          uVar3 = (uint)*(byte *)((long)structure_local + 1);
          if ((uchar *)(value + uVar3) <= stream->limit) {
            if (*structure_local == '\x18') {
              memcpy((void *)((long)structure +
                             (long)(int)(uint)*(ushort *)((long)structure_local + 2)),(void *)value,
                     (ulong)uVar3);
            }
            value = value + uVar3;
            goto LAB_002db1bd;
          }
          cursor._4_4_ = 0x55;
          goto LAB_002db1cb;
        }
        if ((*structure_local & 1) != 0) {
          uStack_40 = (ulong)((int)(uStack_40 << p._4_1_) >> p._4_1_);
        }
        puVar4 = (ulong *)((long)structure + (ulong)*(ushort *)((long)structure_local + 2));
        cVar1 = *(char *)((long)structure_local + 1);
        if (cVar1 == '\x01') {
          *(char *)puVar4 = (char)uStack_40;
        }
        else if (cVar1 == '\x02') {
          *(short *)puVar4 = (short)uStack_40;
        }
        else if (cVar1 == '\x04') {
          *(int *)puVar4 = (int)uStack_40;
        }
        else {
          *puVar4 = uStack_40;
        }
LAB_002db1bd:
        structure_local = (void *)((long)structure_local + 4);
      } while( true );
    }
    stream_local._4_4_ = 0x28;
  }
  return stream_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_ReadFields( FT_Stream              stream,
                        const FT_Frame_Field*  fields,
                        void*                  structure )
  {
    FT_Error  error;
    FT_Bool   frame_accessed = 0;
    FT_Byte*  cursor;


    if ( !fields )
      return FT_THROW( Invalid_Argument );

    if ( !stream )
      return FT_THROW( Invalid_Stream_Handle );

    cursor = stream->cursor;

    error = FT_Err_Ok;
    do
    {
      FT_ULong  value;
      FT_Int    sign_shift;
      FT_Byte*  p;


      switch ( fields->value )
      {
      case ft_frame_start:  /* access a new frame */
        error = FT_Stream_EnterFrame( stream, fields->offset );
        if ( error )
          goto Exit;

        frame_accessed = 1;
        cursor         = stream->cursor;
        fields++;
        continue;  /* loop! */

      case ft_frame_bytes:  /* read a byte sequence */
      case ft_frame_skip:   /* skip some bytes      */
        {
          FT_UInt  len = fields->size;


          if ( cursor + len > stream->limit )
          {
            error = FT_THROW( Invalid_Stream_Operation );
            goto Exit;
          }

          if ( fields->value == ft_frame_bytes )
          {
            p = (FT_Byte*)structure + fields->offset;
            FT_MEM_COPY( p, cursor, len );
          }
          cursor += len;
          fields++;
          continue;
        }

      case ft_frame_byte:
      case ft_frame_schar:  /* read a single byte */
        value = FT_NEXT_BYTE( cursor );
        sign_shift = 24;
        break;

      case ft_frame_short_be:
      case ft_frame_ushort_be:  /* read a 2-byte big-endian short */
        value = FT_NEXT_USHORT( cursor );
        sign_shift = 16;
        break;

      case ft_frame_short_le:
      case ft_frame_ushort_le:  /* read a 2-byte little-endian short */
        value = FT_NEXT_USHORT_LE( cursor );
        sign_shift = 16;
        break;

      case ft_frame_long_be:
      case ft_frame_ulong_be:  /* read a 4-byte big-endian long */
        value = FT_NEXT_ULONG( cursor );
        sign_shift = 0;
        break;

      case ft_frame_long_le:
      case ft_frame_ulong_le:  /* read a 4-byte little-endian long */
        value = FT_NEXT_ULONG_LE( cursor );
        sign_shift = 0;
        break;

      case ft_frame_off3_be:
      case ft_frame_uoff3_be:  /* read a 3-byte big-endian long */
        value = FT_NEXT_UOFF3( cursor );
        sign_shift = 8;
        break;

      case ft_frame_off3_le:
      case ft_frame_uoff3_le:  /* read a 3-byte little-endian long */
        value = FT_NEXT_UOFF3_LE( cursor );
        sign_shift = 8;
        break;

      default:
        /* otherwise, exit the loop */
        stream->cursor = cursor;
        goto Exit;
      }

      /* now, compute the signed value is necessary */
      if ( fields->value & FT_FRAME_OP_SIGNED )
        value = (FT_ULong)( (FT_Int32)( value << sign_shift ) >> sign_shift );

      /* finally, store the value in the object */

      p = (FT_Byte*)structure + fields->offset;
      switch ( fields->size )
      {
      case ( 8 / FT_CHAR_BIT ):
        *(FT_Byte*)p = (FT_Byte)value;
        break;

      case ( 16 / FT_CHAR_BIT ):
        *(FT_UShort*)p = (FT_UShort)value;
        break;

      case ( 32 / FT_CHAR_BIT ):
        *(FT_UInt32*)p = (FT_UInt32)value;
        break;

      default:  /* for 64-bit systems */
        *(FT_ULong*)p = (FT_ULong)value;
      }

      /* go to next field */
      fields++;
    }
    while ( 1 );

  Exit:
    /* close the frame if it was opened by this read */
    if ( frame_accessed )
      FT_Stream_ExitFrame( stream );

    return error;
  }